

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int propagateConstants(Parse *pParse,Select *p)

{
  SrcList *pSVar1;
  WhereConst local_88;
  Walker local_60;
  
  local_88.pOomFault = &pParse->db->mallocFailed;
  local_88.pParse = pParse;
  do {
    local_88.nConst = 0;
    local_88.nChng = 0;
    local_88.apExpr = (Expr **)0x0;
    local_88.bHasAffBlob = 0;
    pSVar1 = p->pSrc;
    if (((pSVar1 == (SrcList *)0x0) || (pSVar1->nSrc < 1)) ||
       (local_88.mExcludeOn = 3, (pSVar1->a[0].fg.jointype & 0x40) == 0)) {
      local_88.mExcludeOn = 1;
    }
    findConstInWhere(&local_88,p->pWhere);
    if (local_88.nConst == 0) {
    }
    else {
      local_60.xExprCallback = propagateConstantExprRewrite;
      local_60.xSelectCallback = sqlite3SelectWalkNoop;
      local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_60.walkerDepth = 0;
      local_60.eCode = 0;
      local_60.mWFlags = 0;
      local_60.pParse = pParse;
      local_60.u.pNC = (NameContext *)&local_88;
      if (p->pWhere != (Expr *)0x0) {
        local_60.u.pNC = (NameContext *)&local_88;
        sqlite3WalkExprNN(&local_60,p->pWhere);
      }
      if (local_88.apExpr != (Expr **)0x0) {
        sqlite3DbFreeNN((local_88.pParse)->db,local_88.apExpr);
      }
    }
  } while (local_88.nChng != 0);
  return 0;
}

Assistant:

static int propagateConstants(
  Parse *pParse,   /* The parsing context */
  Select *p        /* The query in which to propagate constants */
){
  WhereConst x;
  Walker w;
  int nChng = 0;
  x.pParse = pParse;
  x.pOomFault = &pParse->db->mallocFailed;
  do{
    x.nConst = 0;
    x.nChng = 0;
    x.apExpr = 0;
    x.bHasAffBlob = 0;
    if( ALWAYS(p->pSrc!=0)
     && p->pSrc->nSrc>0
     && (p->pSrc->a[0].fg.jointype & JT_LTORJ)!=0
    ){
      /* Do not propagate constants on any ON clause if there is a
      ** RIGHT JOIN anywhere in the query */
      x.mExcludeOn = EP_InnerON | EP_OuterON;
    }else{
      /* Do not propagate constants through the ON clause of a LEFT JOIN */
      x.mExcludeOn = EP_OuterON;
    }
    findConstInWhere(&x, p->pWhere);
    if( x.nConst ){
      memset(&w, 0, sizeof(w));
      w.pParse = pParse;
      w.xExprCallback = propagateConstantExprRewrite;
      w.xSelectCallback = sqlite3SelectWalkNoop;
      w.xSelectCallback2 = 0;
      w.walkerDepth = 0;
      w.u.pConst = &x;
      sqlite3WalkExpr(&w, p->pWhere);
      sqlite3DbFree(x.pParse->db, x.apExpr);
      nChng += x.nChng;
    }
  }while( x.nChng );
  return nChng;
}